

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-lex.c
# Opt level: O0

ztlex_t * ztlex_from_file(ztlex_mallocfn_t *mallocfn,ztlex_freefn_t *freefn,char *filename)

{
  FILE *pFVar1;
  char *in_RDX;
  ztlex_freefn_t *in_RSI;
  code *in_RDI;
  ztlex_t *lex;
  ztlex_t *local_8;
  
  local_8 = (ztlex_t *)(*in_RDI)(0x360);
  if (local_8 == (ztlex_t *)0x0) {
    local_8 = (ztlex_t *)0x0;
  }
  else {
    pFVar1 = fopen(in_RDX,"r");
    local_8->file = (FILE *)pFVar1;
    if (local_8->file == (FILE *)0x0) {
      (*in_RSI)(local_8);
      local_8 = (ztlex_t *)0x0;
    }
    else {
      local_8->ungottenptr = local_8->ungotten;
      local_8->string = (char *)0x0;
      local_8->length = 0;
      local_8->index = 0;
      local_8->line = 1;
      local_8->column = 1;
      local_8->prevcolumn = -1;
      local_8->getC = ztlex_fgetc;
      local_8->ungetC = ztlex_fungetc;
      local_8->freefn = in_RSI;
    }
  }
  return local_8;
}

Assistant:

ztlex_t *ztlex_from_file(ztlex_mallocfn_t *mallocfn,
                         ztlex_freefn_t   *freefn,
                         const char       *filename)
{
  ztlex_t *lex = NULL;

  lex = mallocfn(sizeof(*lex));
  if (lex == NULL)
    return NULL;

  lex->file = fopen(filename, "r");
  if (lex->file == NULL)
  {
    freefn(lex);
    return NULL;
  }

  lex->ungottenptr = &lex->ungotten[0];

  lex->string      = NULL;
  lex->length      = 0;
  lex->index       = 0;

  lex->line        = 1;
  lex->column      = 1;
  lex->prevcolumn  = -1;

  lex->getC        = ztlex_fgetc;
  lex->ungetC      = ztlex_fungetc;

  lex->freefn      = freefn;

  return lex;
}